

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::SetGeneratorPlatform(cmGlobalGenerator *this,string *p,cmMakefile *mf)

{
  ulong uVar1;
  ostream *poVar2;
  bool bVar3;
  string local_1f0;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream e;
  cmMakefile *mf_local;
  string *p_local;
  cmGlobalGenerator *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  bVar3 = (uVar1 & 1) != 0;
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,"Generator\n  ");
    (*this->_vptr_cmGlobalGenerator[3])(local_1d0);
    poVar2 = std::operator<<(poVar2,local_1d0);
    poVar2 = std::operator<<(poVar2,"\ndoes not support platform specification, but platform\n  ");
    poVar2 = std::operator<<(poVar2,(string *)p);
    std::operator<<(poVar2,"\nwas specified.");
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return bVar3;
}

Assistant:

bool cmGlobalGenerator::SetGeneratorPlatform(std::string const& p,
                                             cmMakefile* mf)
{
  if (p.empty()) {
    return true;
  }

  std::ostringstream e;
  /* clang-format off */
  e <<
    "Generator\n"
    "  " << this->GetName() << "\n"
    "does not support platform specification, but platform\n"
    "  " << p << "\n"
    "was specified.";
  /* clang-format on */
  mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
  return false;
}